

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SemanticModelTester.cpp
# Opt level: O2

void __thiscall psy::C::SemanticModelTester::case0150(SemanticModelTester *this)

{
  bool bVar1;
  TypeKind TVar2;
  DeclarationCategory DVar3;
  SymbolKind SVar4;
  int iVar5;
  FunctionDeclarationSymbol *this_00;
  Lexeme *pLVar6;
  Type *pTVar7;
  undefined4 extraout_var;
  FunctionDeclarationSymbol *this_01;
  ostream *poVar8;
  undefined8 uVar9;
  allocator<char> local_6a;
  allocator<char> local_69;
  SemanticModel *local_68;
  FunctionDefinitionSyntax *local_60;
  string local_58;
  string local_38 [32];
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"void x ( ) { }",&local_69)
  ;
  std::__cxx11::string::string<std::allocator<char>>(local_38,"",&local_6a);
  compile<psy::C::FunctionDefinitionSyntax>
            ((SemanticModelTester *)&local_68,(string *)this,&local_58);
  std::__cxx11::string::~string(local_38);
  std::__cxx11::string::~string((string *)&local_58);
  this_00 = SemanticModel::functionFor(local_68,local_60);
  if (this_00 == (FunctionDeclarationSymbol *)0x0) {
    poVar8 = std::operator<<((ostream *)&std::cout,"\n!\tFAIL\n");
    poVar8 = std::operator<<(poVar8,"\t\tExpression is NOT ");
    poVar8 = std::operator<<(poVar8,"true");
    poVar8 = std::operator<<(poVar8,"\n");
    poVar8 = std::operator<<(poVar8,"\t\t");
    poVar8 = std::operator<<(poVar8,
                             "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/tests/SemanticModelTester.cpp"
                            );
    poVar8 = std::operator<<(poVar8,":");
    iVar5 = 0x150;
  }
  else {
    pLVar6 = &FunctionDeclarationSymbol::name(this_00)->super_Lexeme;
    Lexeme::valueText_abi_cxx11_(&local_58,pLVar6);
    bVar1 = std::operator==(&local_58,"x");
    std::__cxx11::string::~string((string *)&local_58);
    if (!bVar1) {
      poVar8 = std::operator<<((ostream *)&std::cout,"\n!\tFAIL\n");
      poVar8 = std::operator<<(poVar8,"\t\tActual  : ");
      pLVar6 = &FunctionDeclarationSymbol::name(this_00)->super_Lexeme;
      Lexeme::valueText_abi_cxx11_(&local_58,pLVar6);
      poVar8 = std::operator<<(poVar8,(string *)&local_58);
      poVar8 = std::operator<<(poVar8,"\n");
      poVar8 = std::operator<<(poVar8,"\t\tExpected: ");
      poVar8 = std::operator<<(poVar8,"x");
      poVar8 = std::operator<<(poVar8,"\n");
      poVar8 = std::operator<<(poVar8,"\t\t");
      poVar8 = std::operator<<(poVar8,
                               "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/tests/SemanticModelTester.cpp"
                              );
      poVar8 = std::operator<<(poVar8,":");
      poVar8 = (ostream *)std::ostream::operator<<((ostream *)poVar8,0x151);
      std::endl<char,std::char_traits<char>>(poVar8);
      std::__cxx11::string::~string((string *)&local_58);
      goto LAB_0038ad50;
    }
    pTVar7 = FunctionDeclarationSymbol::type(this_00);
    TVar2 = Type::kind(pTVar7);
    if (TVar2 == Function) {
      iVar5 = (*(local_60->decltor_->super_SyntaxNode).super_Managed._vptr_Managed[0x57])();
      this_01 = (FunctionDeclarationSymbol *)
                SemanticModel::declarationBy
                          (local_68,(DeclaratorSyntax *)CONCAT44(extraout_var,iVar5));
      if (this_01 == (FunctionDeclarationSymbol *)0x0) {
        poVar8 = std::operator<<((ostream *)&std::cout,"\n!\tFAIL\n");
        poVar8 = std::operator<<(poVar8,"\t\tExpression is NOT ");
        poVar8 = std::operator<<(poVar8,"true");
        poVar8 = std::operator<<(poVar8,"\n");
        poVar8 = std::operator<<(poVar8,"\t\t");
        poVar8 = std::operator<<(poVar8,
                                 "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/tests/SemanticModelTester.cpp"
                                );
        poVar8 = std::operator<<(poVar8,":");
        iVar5 = 0x157;
      }
      else {
        DVar3 = DeclarationSymbol::category((DeclarationSymbol *)this_01);
        if (DVar3 == Function) {
          SVar4 = Symbol::kind((Symbol *)this_01);
          if (SVar4 == FunctionDeclaration) {
            if (this_01 == this_00) {
              return;
            }
            poVar8 = std::operator<<((ostream *)&std::cout,"\n!\tFAIL\n");
            poVar8 = std::operator<<(poVar8,"\t\tActual  : ");
            poVar8 = C::operator<<(poVar8,(DeclarationSymbol *)this_01);
            poVar8 = std::operator<<(poVar8,"\n");
            poVar8 = std::operator<<(poVar8,"\t\tExpected: ");
            poVar8 = C::operator<<(poVar8,this_00);
            poVar8 = std::operator<<(poVar8,"\n");
            poVar8 = std::operator<<(poVar8,"\t\t");
            poVar8 = std::operator<<(poVar8,
                                     "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/tests/SemanticModelTester.cpp"
                                    );
            poVar8 = std::operator<<(poVar8,":");
            iVar5 = 0x15a;
          }
          else {
            poVar8 = std::operator<<((ostream *)&std::cout,"\n!\tFAIL\n");
            poVar8 = std::operator<<(poVar8,"\t\tExpression is NOT ");
            poVar8 = std::operator<<(poVar8,"true");
            poVar8 = std::operator<<(poVar8,"\n");
            poVar8 = std::operator<<(poVar8,"\t\t");
            poVar8 = std::operator<<(poVar8,
                                     "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/tests/SemanticModelTester.cpp"
                                    );
            poVar8 = std::operator<<(poVar8,":");
            iVar5 = 0x159;
          }
        }
        else {
          poVar8 = std::operator<<((ostream *)&std::cout,"\n!\tFAIL\n");
          poVar8 = std::operator<<(poVar8,"\t\tExpression is NOT ");
          poVar8 = std::operator<<(poVar8,"true");
          poVar8 = std::operator<<(poVar8,"\n");
          poVar8 = std::operator<<(poVar8,"\t\t");
          poVar8 = std::operator<<(poVar8,
                                   "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/tests/SemanticModelTester.cpp"
                                  );
          poVar8 = std::operator<<(poVar8,":");
          iVar5 = 0x158;
        }
      }
    }
    else {
      poVar8 = std::operator<<((ostream *)&std::cout,"\n!\tFAIL\n");
      poVar8 = std::operator<<(poVar8,"\t\tActual  : ");
      pTVar7 = FunctionDeclarationSymbol::type(this_00);
      TVar2 = Type::kind(pTVar7);
      poVar8 = ::operator<<(poVar8,TVar2);
      poVar8 = std::operator<<(poVar8,"\n");
      poVar8 = std::operator<<(poVar8,"\t\tExpected: ");
      poVar8 = ::operator<<(poVar8,Function);
      poVar8 = std::operator<<(poVar8,"\n");
      poVar8 = std::operator<<(poVar8,"\t\t");
      poVar8 = std::operator<<(poVar8,
                               "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/tests/SemanticModelTester.cpp"
                              );
      poVar8 = std::operator<<(poVar8,":");
      iVar5 = 0x152;
    }
  }
  poVar8 = (ostream *)std::ostream::operator<<((ostream *)poVar8,iVar5);
  std::endl<char,std::char_traits<char>>(poVar8);
LAB_0038ad50:
  uVar9 = __cxa_allocate_exception(1);
  __cxa_throw(uVar9,&TestFailed::typeinfo,0);
}

Assistant:

void SemanticModelTester::case0150()
{
    auto [funcDefNode, semaModel] =
            compile<FunctionDefinitionSyntax>("void x ( ) { }");

    const FunctionDeclarationSymbol* funcDeclSym = semaModel->functionFor(funcDefNode);
    PSY_EXPECT_TRUE(funcDeclSym);
    PSY_EXPECT_EQ_STR(funcDeclSym->name()->valueText(), "x");
    PSY_EXPECT_EQ_ENU(funcDeclSym->type()->kind(), TypeKind::Function, TypeKind);

    auto decltor = funcDefNode->declarator();
    auto arrOrFunDecltor = decltor->asArrayOrFunctionDeclarator();
    const DeclarationSymbol* declSym = semaModel->declarationBy(arrOrFunDecltor);
    PSY_EXPECT_TRUE(declSym);
    PSY_EXPECT_TRUE(declSym->category() == DeclarationCategory::Function);
    PSY_EXPECT_TRUE(declSym->kind() == SymbolKind::FunctionDeclaration);
    PSY_EXPECT_EQ_PTR(declSym, funcDeclSym);
}